

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

int Abc_NtkGetCubeNum(Abc_Ntk_t *pNtk)

{
  Abc_Obj_t *pNode;
  int iVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  long lVar4;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                  ,0x77,"int Abc_NtkGetCubeNum(Abc_Ntk_t *)");
  }
  pVVar2 = pNtk->vObjs;
  if (pVVar2->nSize < 1) {
    iVar3 = 0;
  }
  else {
    lVar4 = 0;
    iVar3 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar2->pArray[lVar4];
      if (((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) &&
         (iVar1 = Abc_NodeIsConst(pNode), iVar1 == 0)) {
        if ((char *)(pNode->field_5).pData == (char *)0x0) {
          __assert_fail("pNode->pData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                        ,0x7c,"int Abc_NtkGetCubeNum(Abc_Ntk_t *)");
        }
        iVar1 = Abc_SopGetCubeNum((char *)(pNode->field_5).pData);
        iVar3 = iVar3 + iVar1;
      }
      lVar4 = lVar4 + 1;
      pVVar2 = pNtk->vObjs;
    } while (lVar4 < pVVar2->nSize);
  }
  return iVar3;
}

Assistant:

int Abc_NtkGetCubeNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, nCubes = 0;
    assert( Abc_NtkHasSop(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        if ( Abc_NodeIsConst(pNode) )
            continue;
        assert( pNode->pData );
        nCubes += Abc_SopGetCubeNum( (char *)pNode->pData );
    }
    return nCubes;
}